

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::DGXMLScanner::buildAttList
          (DGXMLScanner *this,XMLSize_t attCount,XMLElementDecl *elemDecl,
          RefVectorOf<xercesc_4_0::XMLAttr> *toFill)

{
  XMLValidator *pXVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DefAttTypes DVar5;
  AttTypes AVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  XMLAttDef *pXVar9;
  uint *puVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLCh *attPrefix;
  XMLAttr *local_78;
  XMLAttr *curAtt;
  DefAttTypes defType;
  uint *attCountPtr;
  XMLAttDef *curDef;
  XMLSize_t i;
  XMLAttDefList *attDefList;
  XMLSize_t curAttListSize;
  XMLSize_t retCount;
  bool hasDefs;
  RefVectorOf<xercesc_4_0::XMLAttr> *toFill_local;
  XMLElementDecl *elemDecl_local;
  XMLSize_t attCount_local;
  DGXMLScanner *this_local;
  long *plVar8;
  
  uVar3 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if (((uVar3 & 1) == 0) && (attCount == 0)) {
    this_local = (DGXMLScanner *)0x0;
  }
  else {
    XVar7 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::size
                      (&toFill->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
    curAttListSize = attCount;
    if ((uVar3 & 1) != 0) {
      iVar4 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
      plVar8 = (long *)CONCAT44(extraout_var,iVar4);
      for (curDef = (XMLAttDef *)0x0; pXVar9 = (XMLAttDef *)(**(code **)(*plVar8 + 0x50))(),
          curDef < pXVar9;
          curDef = (XMLAttDef *)((long)&(curDef->super_XSerializable)._vptr_XSerializable + 1)) {
        pXVar9 = (XMLAttDef *)(**(code **)(*plVar8 + 0x58))(plVar8,curDef);
        puVar10 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                            (this->fAttDefRegistry,pXVar9);
        if ((puVar10 == (uint *)0x0) || (*puVar10 < this->fElemCount)) {
          DVar5 = XMLAttDef::getDefaultType(pXVar9);
          if (((this->super_XMLScanner).fValidate & 1U) != 0) {
            if (DVar5 == Required) {
              pXVar1 = (this->super_XMLScanner).fValidator;
              iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
              XMLValidator::emitError
                        (pXVar1,RequiredAttrNotProvided,(XMLCh *)CONCAT44(extraout_var_00,iVar4),
                         (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            else if ((((DVar5 == DefAttTypes_Min) || (DVar5 == Fixed)) &&
                     (((this->super_XMLScanner).fStandalone & 1U) != 0)) &&
                    (bVar2 = XMLAttDef::isExternal(pXVar9), bVar2)) {
              pXVar1 = (this->super_XMLScanner).fValidator;
              iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
              pXVar11 = XMLElementDecl::getFullName(elemDecl);
              XMLValidator::emitError
                        (pXVar1,NoDefAttForStandalone,(XMLCh *)CONCAT44(extraout_var_01,iVar4),
                         pXVar11,(XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
          if ((DVar5 == DefAttTypes_Min) || (DVar5 == Fixed)) {
            if (((this->super_XMLScanner).fValidate & 1U) != 0) {
              pXVar1 = (this->super_XMLScanner).fValidator;
              pXVar11 = XMLAttDef::getValue(pXVar9);
              (*pXVar1->_vptr_XMLValidator[8])(pXVar1,pXVar9,pXVar11,0,elemDecl);
            }
            if (curAttListSize < XVar7) {
              local_78 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                   (&((this->super_XMLScanner).fAttrList)->
                                     super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,curAttListSize);
              if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
                iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
                pXVar11 = XMLAttDef::getValue(pXVar9);
                AVar6 = XMLAttDef::getType(pXVar9);
                XMLAttr::set(local_78,0,(XMLCh *)CONCAT44(extraout_var_05,iVar4),L"",pXVar11,AVar6,
                             (DatatypeValidator *)0x0,false);
              }
              else {
                uVar3 = (this->super_XMLScanner).fEmptyNamespaceId;
                iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
                pXVar11 = XMLAttDef::getValue(pXVar9);
                AVar6 = XMLAttDef::getType(pXVar9);
                XMLAttr::set(local_78,uVar3,(XMLCh *)CONCAT44(extraout_var_04,iVar4),pXVar11,AVar6,
                             (DatatypeValidator *)0x0,false);
              }
              XMLAttr::setSpecified(local_78,false);
            }
            else {
              if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
                local_78 = (XMLAttr *)
                           XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
                iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
                pXVar11 = XMLAttDef::getValue(pXVar9);
                AVar6 = XMLAttDef::getType(pXVar9);
                XMLAttr::XMLAttr(local_78,0,(XMLCh *)CONCAT44(extraout_var_03,iVar4),L"",pXVar11,
                                 AVar6,false,(this->super_XMLScanner).fMemoryManager,
                                 (DatatypeValidator *)0x0,false);
              }
              else {
                local_78 = (XMLAttr *)
                           XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
                uVar3 = (this->super_XMLScanner).fEmptyNamespaceId;
                iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
                pXVar11 = XMLAttDef::getValue(pXVar9);
                AVar6 = XMLAttDef::getType(pXVar9);
                XMLAttr::XMLAttr(local_78,uVar3,(XMLCh *)CONCAT44(extraout_var_02,iVar4),pXVar11,
                                 AVar6,false,(this->super_XMLScanner).fMemoryManager,
                                 (DatatypeValidator *)0x0,false);
              }
              BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,local_78);
            }
            if (((((this->super_XMLScanner).fDoNamespaces & 1U) != 0) &&
                (pXVar11 = XMLAttr::getPrefix(local_78), pXVar11 != (XMLCh *)0x0)) &&
               (*pXVar11 != L'\0')) {
              uVar3 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar11,Mode_Attribute);
              XMLAttr::setURIId(local_78,uVar3);
            }
            curAttListSize = curAttListSize + 1;
          }
        }
      }
    }
    this_local = (DGXMLScanner *)curAttListSize;
  }
  return (XMLSize_t)this_local;
}

Assistant:

XMLSize_t
DGXMLScanner::buildAttList(const XMLSize_t              attCount
                          ,       XMLElementDecl*       elemDecl
                          ,       RefVectorOf<XMLAttr>& toFill)
{
    //  Ask the element to clear the 'provided' flag on all of the att defs
    //  that it owns, and to return us a boolean indicating whether it has
    //  any defs.
    const bool hasDefs = elemDecl->hasAttDefs();

    //  If there are no expliclitily provided attributes and there are no
    //  defined attributes for the element, the we don't have anything to do.
    //  So just return zero in this case.
    if (!hasDefs && !attCount)
        return 0;

    // Keep up with how many attrs we end up with total
    XMLSize_t retCount = attCount;

    //  And get the current size of the output vector. This lets us use
    //  existing elements until we fill it, then start adding new ones.
    const XMLSize_t curAttListSize = toFill.size();

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (hasDefs)
    {
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            XMLAttDef& curDef = attDefList.getAttDef(i);

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());
                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (retCount >= curAttListSize)
                    {
                        if (fDoNamespaces)
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }
                        else
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }

                        fAttrList->addElement(curAtt);
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(retCount);
                        if (fDoNamespaces)
                        {
                            curAtt->set
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        else
                        {
                            curAtt->set
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        curAtt->setSpecified(false);
                    }

                    if (fDoNamespaces)
                    {
                        //  Map the new attribute's prefix to a URI id and store
                        //  that in the attribute object.
                        const XMLCh* attPrefix = curAtt->getPrefix();
                        if (attPrefix && *attPrefix) {
                            curAtt->setURIId
                            (
                                resolvePrefix(attPrefix, ElemStack::Mode_Attribute)
                            );
                        }
                    }

                    retCount++;
                }
            }
        }
    }

    return retCount;
}